

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::Generator::FixOptionsForOneof
          (Generator *this,OneofDescriptor *oneof)

{
  bool bVar1;
  SubstituteArg *in_stack_fffffffffffffd98;
  string local_260;
  string oneof_options;
  string oneof_name;
  SubstituteArg local_200;
  string local_1d0;
  SubstituteArg local_1a0;
  SubstituteArg local_170;
  SubstituteArg local_140;
  SubstituteArg local_110;
  SubstituteArg local_e0;
  SubstituteArg local_b0;
  SubstituteArg local_80;
  SubstituteArg local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"OneofOptions",(allocator<char> *)&local_1a0);
  MessageLite::SerializeAsString_abi_cxx11_((string *)&local_200,*(MessageLite **)(oneof + 0x28));
  OptionsValue(&oneof_options,this,&local_1d0,(string *)&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1d0);
  bVar1 = std::operator!=(&oneof_options,"None");
  if (bVar1) {
    ModuleLevelDescriptorName<google::protobuf::Descriptor>
              (&local_260,this,*(Descriptor **)(oneof + 0x10));
    local_1d0._M_dataplus._M_p = local_260._M_dataplus._M_p;
    local_1d0._M_string_length._0_4_ = (undefined4)local_260._M_string_length;
    local_200.text_ = "oneofs_by_name";
    local_200.size_ = 0xe;
    local_1a0.text_ = (char *)**(undefined8 **)oneof;
    local_1a0.size_ = *(int *)(*(undefined8 **)oneof + 1);
    local_50.text_ = (char *)0x0;
    local_50.size_ = -1;
    local_80.text_ = (char *)0x0;
    local_80.size_ = -1;
    local_b0.text_ = (char *)0x0;
    local_b0.size_ = -1;
    local_e0.text_ = (char *)0x0;
    local_e0.size_ = -1;
    local_110.text_ = (char *)0x0;
    local_110.size_ = -1;
    local_140.text_ = (char *)0x0;
    local_140.size_ = -1;
    local_170.text_ = (char *)0x0;
    local_170.size_ = -1;
    strings::Substitute_abi_cxx11_
              (&oneof_name,(strings *)"$0.$1[\'$2\']",(char *)&local_1d0,&local_200,&local_1a0,
               &local_50,&local_80,&local_b0,&local_e0,&local_110,&local_140,&local_170,
               in_stack_fffffffffffffd98);
    std::__cxx11::string::~string((string *)&local_260);
    anon_unknown_0::PrintDescriptorOptionsFixingCode(&oneof_name,&oneof_options,this->printer_);
    std::__cxx11::string::~string((string *)&oneof_name);
  }
  std::__cxx11::string::~string((string *)&oneof_options);
  return;
}

Assistant:

void Generator::FixOptionsForOneof(const OneofDescriptor& oneof) const {
  string oneof_options = OptionsValue(
      "OneofOptions", oneof.options().SerializeAsString());
  if (oneof_options != "None") {
    string oneof_name = strings::Substitute(
        "$0.$1['$2']",
        ModuleLevelDescriptorName(*oneof.containing_type()),
        "oneofs_by_name", oneof.name());
    PrintDescriptorOptionsFixingCode(oneof_name, oneof_options, printer_);
  }
}